

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O1

real __thiscall fasttext::Vector::norm(Vector *this)

{
  size_t sVar1;
  size_t sVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  sVar1 = (this->data_).size_;
  auVar4 = ZEXT816(0) << 0x40;
  if (0 < (long)sVar1) {
    sVar2 = 0;
    do {
      auVar5 = ZEXT416((uint)(this->data_).mem_[sVar2]);
      auVar4 = vfmadd231ss_fma(auVar4,auVar5,auVar5);
      sVar2 = sVar2 + 1;
    } while (sVar1 != sVar2);
  }
  if (0.0 <= auVar4._0_4_) {
    auVar4 = vsqrtss_avx(auVar4,auVar4);
    return auVar4._0_4_;
  }
  fVar3 = sqrtf(auVar4._0_4_);
  return fVar3;
}

Assistant:

real Vector::norm() const {
  real sum = 0;
  for (int64_t i = 0; i < size(); i++) {
    sum += data_[i] * data_[i];
  }
  return std::sqrt(sum);
}